

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_0::FakeFileReader::FakeFileReader(FakeFileReader *this)

{
  Clock *clock;
  String *pSVar1;
  PathPtr path;
  PathPtr local_78;
  ArrayPtr<const_char> local_68 [2];
  initializer_list<kj::StringPtr> local_48;
  Path local_38;
  Own<kj::Directory> local_20;
  FakeFileReader *local_10;
  FakeFileReader *this_local;
  
  local_10 = this;
  kj::Filesystem::Filesystem(&this->super_Filesystem);
  (this->super_Filesystem)._vptr_Filesystem = (_func_int **)&PTR_getRoot_00cbfaa0;
  clock = kj::nullClock();
  kj::newInMemoryDirectory((kj *)&local_20,clock);
  kj::Own<const_kj::Directory>::Own(&this->root,&local_20);
  kj::Own<kj::Directory>::~Own(&local_20);
  std::initializer_list<kj::StringPtr>::initializer_list(&local_48);
  kj::Path::Path(&local_38,local_48);
  kj::StringPtr::StringPtr((StringPtr *)local_68,"/path/to/current/dir");
  kj::Path::evalNative(&this->cwd,&local_38,(StringPtr)local_68[0]);
  kj::Path::~Path(&local_38);
  pSVar1 = (String *)kj::Own<const_kj::Directory>::operator->(&this->root);
  kj::PathPtr::PathPtr(&local_78,&this->cwd);
  kj::operator|(CREATE,CREATE_PARENT);
  path.parts.size_ = (size_t)local_78.parts.ptr;
  path.parts.ptr = pSVar1;
  kj::Directory::openSubdir((Directory *)&this->current,path,(WriteMode)local_78.parts.size_);
  return;
}

Assistant:

void add(kj::StringPtr name, kj::StringPtr content) {
    root->openFile(cwd.evalNative(name), kj::WriteMode::CREATE | kj::WriteMode::CREATE_PARENT)
        ->writeAll(content);
  }